

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputLayers.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeInputLayers(ConvertLayerParameters layerParameters)

{
  string *psVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  const_iterator __cbeg;
  Type *pTVar5;
  ostream *poVar6;
  LogMessage *pLVar7;
  long lVar8;
  mapped_type *this;
  runtime_error *prVar9;
  long *plVar10;
  long *plVar11;
  InputParameter *pIVar12;
  long in_stack_00000008;
  vector<long,_std::allocator<long>_> dims;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
  *in_stack_00000038;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *in_stack_00000040;
  int *in_stack_00000048;
  stringstream ss;
  LogFinisher local_249;
  vector<long,_std::allocator<long>_> local_248;
  LogMessage local_228;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [23];
  LogMessage local_68;
  
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  iVar4 = std::__cxx11::string::compare((char *)(pTVar5->type_).ptr_);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"WARNING: Skipping Data Layer \'",0x1e);
    psVar1 = (pTVar5->name_).ptr_;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' of type \'",0xb);
    psVar1 = (pTVar5->type_).ptr_;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\'. It is recommended to use Input layer for deployment.",0x37);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    return;
  }
  pIVar12 = pTVar5->input_param_;
  if (pIVar12 == (InputParameter *)0x0) {
    pIVar12 = (InputParameter *)&caffe::_InputParameter_default_instance_;
  }
  if ((pIVar12->shape_).super_RepeatedPtrFieldBase.current_size_ != 0) {
    if ((pIVar12->shape_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar7 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1f0,pLVar7);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pvVar2 = ((pIVar12->shape_).super_RepeatedPtrFieldBase.rep_)->elements[0];
    local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (long *)0x0;
    local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    lVar8 = (long)*(int *)((long)pvVar2 + 0x18);
    if (lVar8 != 0) {
      lVar3 = *(long *)((long)pvVar2 + 0x20);
      plVar10 = (long *)(lVar3 + 8);
      if (lVar3 == 0) {
        plVar10 = (long *)0x0;
      }
      plVar11 = (long *)(lVar3 + 8 + lVar8 * 8);
      if (lVar3 == 0) {
        plVar11 = (long *)0x0;
      }
      if (plVar10 != plVar11) {
        do {
          if (*plVar10 < 0) {
            __assert_fail("dim >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InputLayers.cpp"
                          ,0x2f,
                          "void CoreMLConverter::convertCaffeInputLayers(CoreMLConverter::ConvertLayerParameters)"
                         );
          }
          if (local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_248,
                       (iterator)
                       local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,plVar10);
          }
          else {
            *local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = *plVar10;
            local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          plVar10 = plVar10 + 1;
        } while (plVar10 != plVar11);
      }
      if ((long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start == 0x10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Ignoring batch/seq size and retaining only the last dimension for conversion. ",
                   0x4e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        plVar10 = local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
        if (local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != plVar10) {
          *local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_start = *plVar10;
          plVar10 = (long *)(((long)local_248.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar10) +
                            (long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          if (local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish != plVar10) {
            local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = plVar10;
          }
        }
      }
      if (0x18 < (ulong)((long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Ignoring batch size and retaining only the trailing 3 dimensions for conversion. "
                   ,0x51);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        plVar10 = local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish + -3;
        if (local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != plVar10) {
          lVar8 = *plVar10;
          lVar3 = local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish[-2];
          local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[2] = local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1];
          *local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_start = lVar8;
          local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[1] = lVar3;
          plVar10 = (long *)(((long)local_248.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar10) +
                            (long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          if (local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish != plVar10) {
            local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = plVar10;
          }
        }
      }
      if ((pTVar5->top_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        local_1f0._0_8_ = local_1f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f0,"Caffe layer does not have a top blob ","");
        errorInCaffeProto((string *)local_1f0,(pTVar5->name_).ptr_,(pTVar5->type_).ptr_);
        if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
          operator_delete((void *)local_1f0._0_8_,local_1e0[0]._M_allocated_capacity + 1);
        }
      }
      if ((pTVar5->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_228,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar7 = google::protobuf::internal::LogMessage::operator<<
                           (&local_228,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1f0,pLVar7);
        google::protobuf::internal::LogMessage::~LogMessage(&local_228);
      }
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
             ::operator[](in_stack_00000038,
                          (key_type *)((pTVar5->top_).super_RepeatedPtrFieldBase.rep_)->elements[0])
      ;
      std::vector<long,_std::allocator<long>_>::operator=(this,&local_248);
      if ((pTVar5->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar7 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_249,pLVar7);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                (in_stack_00000040,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((pTVar5->top_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      if (local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (long *)0x0) {
        operator_delete(local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1f0 + 0x10),"Invalid caffe model: Input layer \'",0x22);
    psVar1 = (pTVar5->name_).ptr_;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1f0 + 0x10),(psVar1->_M_dataplus)._M_p,
                        psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\' does not specify dimensions.",0x1e);
    std::endl<char,std::char_traits<char>>(poVar6);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&local_228);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1f0 + 0x10),"Invalid caffe model: Input layer \'",0x22);
  psVar1 = (pTVar5->name_).ptr_;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1f0 + 0x10),(psVar1->_M_dataplus)._M_p,
                      psVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"\' does not specify the shape parameter.",0x27);
  std::endl<char,std::char_traits<char>>(poVar6);
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar9,(string *)&local_228);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoreMLConverter::convertCaffeInputLayers(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::vector<int64_t> >& mapBlobNameToDimensions = layerParameters.mapBlobNameToDimensions;
    std::set<std::string>& caffeNetworkInputNames = layerParameters.caffeNetworkInputNames;
    
    /*
     Mapping from Caffe Input Layer dimensions to CoreML Specification input dimensions:
     1-D (C) ----> (C)
     2-D : (Batch/Seq,C) ----> (C) [last dimension retained]
     >=3-D (...,C,H,W) ----> (C,H,W) [last 3 dimensions retained]
     */
    
    if (caffeLayer.type() == "Input"){
        if (caffeLayer.input_param().shape_size() == 0) {
            std::stringstream ss;
            ss << "Invalid caffe model: Input layer '" << caffeLayer.name() << "' does not specify the shape parameter." << std::endl;
            throw std::runtime_error(ss.str());
        }
        const ::caffe::BlobShape& shape = caffeLayer.input_param().shape(0);
        std::vector<int64_t> dims;
        if (shape.dim_size() == 0) {
            std::stringstream ss;
            ss << "Invalid caffe model: Input layer '" << caffeLayer.name() << "' does not specify dimensions." << std::endl;
            throw std::runtime_error(ss.str());
        }
        for (const auto& dim: shape.dim()) {
            assert(dim >= 0);
            dims.push_back(dim);
        }
        if (dims.size() == 2) {
            std::cout<<"Ignoring batch/seq size and retaining only the last dimension for conversion. " << std::endl;
            dims.erase(dims.begin(),dims.end()-1);
        }
        if (dims.size() > 3) {
            std::cout<<"Ignoring batch size and retaining only the trailing 3 dimensions for conversion. " << std::endl;
            dims.erase(dims.begin(),dims.end()-3);
        }
        
        
        if (caffeLayer.top_size() == 0) {
            CoreMLConverter::errorInCaffeProto("Caffe layer does not have a top blob ",caffeLayer.name(),caffeLayer.type());
        }
        mapBlobNameToDimensions[caffeLayer.top(0)] = dims;
        caffeNetworkInputNames.insert(caffeLayer.top(0));
    } else {
        std::cout<<"WARNING: Skipping Data Layer '"<< caffeLayer.name() << "' of type '" << caffeLayer.type() <<"'. It is recommended to use Input layer for deployment."
                <<std::endl;
    }
}